

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::writeVIndices
          (LibraryControllersLoader *this,sint64 *data,size_t length)

{
  ulong in_RDX;
  ArrayPrimitiveType<unsigned_int> *in_RDI;
  UIntValuesArray *weightIndices;
  IntValuesArray *jointIndices;
  uint index;
  size_t i;
  uint *in_stack_ffffffffffffffa8;
  ulong local_28;
  
  if (in_RDI[8].mCount != 0) {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      if (in_RDI[0xd].mCount == in_RDI[0xc].mCapacity) {
        COLLADAFW::SkinControllerData::getJointIndices((SkinControllerData *)in_RDI[8].mCount);
        COLLADAFW::ArrayPrimitiveType<int>::append
                  ((ArrayPrimitiveType<int> *)in_RDI,(int *)in_stack_ffffffffffffffa8);
      }
      if (in_RDI[0xd].mCount == *(size_t *)&in_RDI[0xc].mFlags) {
        COLLADAFW::SkinControllerData::getWeightIndices((SkinControllerData *)in_RDI[8].mCount);
        COLLADAFW::ArrayPrimitiveType<unsigned_int>::append(in_RDI,in_stack_ffffffffffffffa8);
      }
      if ((uint *)in_RDI[0xd].mCount == in_RDI[0xd].mData) {
        in_RDI[0xd].mCount = 0;
      }
      else {
        in_RDI[0xd].mCount = in_RDI[0xd].mCount + 1;
      }
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::writeVIndices ( const sint64* data, size_t length )
	{
		// check, if we are parsing an unsupported primitive type
		if ( !mCurrentSkinControllerData )
			return true;

		// Write the index values in the index lists.
		for ( size_t i=0; i<length; ++i )
		{
			// Get the current index value.
			unsigned int index = (unsigned int)data [i];

			// Write the indices
			if (  mCurrentOffset == mJointOffset )
			{
				COLLADAFW::IntValuesArray& jointIndices = mCurrentSkinControllerData->getJointIndices();
				jointIndices.append ( index );
			}

			if ( mCurrentOffset == mWeightsOffset )
			{
				COLLADAFW::UIntValuesArray& weightIndices = mCurrentSkinControllerData->getWeightIndices();
				weightIndices.append ( index );
			}

			// Reset the offset if we went through all offset values
			if ( mCurrentOffset == mCurrentMaxOffset )
			{
				// Reset the current offset value
				mCurrentOffset = 0;
			}
			else
			{
				// Increment the current offset value
				++mCurrentOffset;
			}
		}
		return true;
	}